

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  ParseError PVar3;
  ostream *poVar4;
  istream *piVar5;
  int iVar6;
  char *pcVar7;
  allocator local_2d1;
  string str;
  string local_2a0;
  char **local_280;
  string mode;
  string code;
  Brainfuck brainfuck;
  
  if (argc < 2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"usage: BrainfuckInterpreter file.bf [i/c]");
    std::endl<char,std::char_traits<char>>(poVar4);
    return -1;
  }
  code._M_dataplus._M_p = (pointer)&code.field_2;
  code._M_string_length = 0;
  code.field_2._M_local_buf[0] = '\0';
  local_280 = argv;
  std::__cxx11::string::string((string *)&local_2a0,argv[1],&local_2d1);
  std::ifstream::ifstream(&brainfuck,(string *)&local_2a0,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::ifstream::~ifstream(&brainfuck);
    std::__cxx11::string::~string((string *)&local_2a0);
    poVar4 = std::operator<<((ostream *)&std::cout,"failed to read input file!");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar6 = -1;
    goto LAB_001046c7;
  }
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&brainfuck,(string *)&str),
        ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
    std::operator+(&mode,&str,"\n");
    std::__cxx11::string::append((string *)&code);
    std::__cxx11::string::~string((string *)&mode);
  }
  std::ifstream::close();
  std::__cxx11::string::~string((string *)&str);
  std::ifstream::~ifstream(&brainfuck);
  std::__cxx11::string::~string((string *)&local_2a0);
  Brainfuck::Brainfuck(&brainfuck);
  PVar3 = Brainfuck::Parse(&brainfuck,&code);
  if (PVar3 == Success) {
    if (argc == 2) {
      pcVar7 = "i";
    }
    else {
      pcVar7 = local_280[2];
    }
    std::__cxx11::string::string((string *)&mode,pcVar7,(allocator *)&str);
    bVar2 = std::operator==(&mode,"i");
    if (bVar2) {
      StdIoInterpreter::StdIoInterpreter((StdIoInterpreter *)&str,30000);
      Brainfuck::Execute(&brainfuck,(Interpreter *)&str);
      StdIoInterpreter::~StdIoInterpreter((StdIoInterpreter *)&str);
LAB_0010468e:
      iVar6 = 0;
    }
    else {
      bVar2 = std::operator==(&mode,"c");
      if (bVar2) {
        CCompiler::CCompiler((CCompiler *)&str);
        Brainfuck::Compile(&brainfuck,(Compiler *)&str);
        CCompiler::GetCode_abi_cxx11_(&local_2a0,(CCompiler *)&str);
        std::operator<<((ostream *)&std::cout,(string *)&local_2a0);
        std::__cxx11::string::~string((string *)&local_2a0);
        CCompiler::~CCompiler((CCompiler *)&str);
        goto LAB_0010468e;
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"Unknown mode!");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar6 = -1;
    }
    std::__cxx11::string::~string((string *)&mode);
  }
  else {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&str);
    poVar4 = std::operator<<((ostream *)&std::cout,"There was an error parsing (");
    poVar4 = std::operator<<(poVar4,(string *)&str);
    poVar4 = std::operator<<(poVar4,") on line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,brainfuck._line);
    poVar4 = std::operator<<(poVar4," column ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,brainfuck._column);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::__cxx11::string::~string((string *)&str);
    iVar6 = -1;
  }
  Brainfuck::~Brainfuck(&brainfuck);
LAB_001046c7:
  std::__cxx11::string::~string((string *)&code);
  return iVar6;
}

Assistant:

int main(int argc, char* argv[])
{
    if(argc < 2)
    {
        std::cout << "usage: BrainfuckInterpreter file.bf [i/c]" << std::endl;
        return -1;
    }

    std::string code;
    if(!readFile(argv[1], code))
    {
        std::cout << "failed to read input file!" << std::endl;
        return -1;
    }

    auto brainfuck = Brainfuck();
    auto error = brainfuck.Parse(code);
    if (error != Brainfuck::Success)
    {
        std::string errorName;
        switch (error)
        {
            case Brainfuck::ErrorBracketMismatch:
                errorName = "ErrorBracketMismatch";
                break;

            case Brainfuck::GenericError:
                errorName = "GenericError";
                break;

            default:
                errorName = "UNKNOWN";
                break;
        }
        int line, column;
        brainfuck.GetLocation(line, column);
        std::cout << "There was an error parsing (" << errorName << ") on line " << line << " column " << column << std::endl;
        return -1;
    }

    auto mode = std::string(argc > 2 ? argv[2] : "i");
    if(mode == "i") //interpret the file
    {
        auto semantics = StdIoInterpreter();
        brainfuck.Execute(semantics);
    }
    else if(mode == "c") //compile to c
    {
        auto compiler = CCompiler();
        brainfuck.Compile(compiler);
        std::cout << compiler.GetCode();
    }
    else
    {
        std::cout << "Unknown mode!" << std::endl;
        return -1;
    }
    return 0;
}